

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

void __thiscall just::test::assert_throw::run<void(*)()>(assert_throw *this,_func_void *f_)

{
  allocator<char> local_49;
  string local_48;
  _func_void *local_18;
  _func_void *f__local;
  assert_throw *this_local;
  
  local_18 = f_;
  f__local = (_func_void *)this;
  (*f_)();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Expression did not throw.",&local_49);
  assert_msg::operator()(&this->_assert_msg,&local_48,false);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

impl::nothing_to_run run(F f_) const
      {
        try
        {
          f_();
        }
        catch (...)
        {
          return impl::nothing_to_run();
        }

        _assert_msg("Expression did not throw.", false);

        return impl::nothing_to_run();
      }